

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O0

void h265e_slice_set_ref_poc_list(H265eSlice *slice)

{
  int local_18;
  int local_14;
  RK_S32 numRefIdx;
  RK_S32 dir;
  H265eSlice *slice_local;
  
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","h265e_slice_set_ref_poc_list");
  }
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < slice->m_numRefIdx[local_14]; local_18 = local_18 + 1) {
      slice->m_refPOCList[local_14][local_18] = slice->m_refPicList[local_14][local_18]->poc;
    }
  }
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","leave\n","h265e_slice_set_ref_poc_list");
  }
  return;
}

Assistant:

void h265e_slice_set_ref_poc_list(H265eSlice *slice)
{
    RK_S32 dir, numRefIdx;

    h265e_dbg_func("enter\n");

    for (dir = 0; dir < 2; dir++) {
        for (numRefIdx = 0; numRefIdx < slice->m_numRefIdx[dir]; numRefIdx++) {
            slice->m_refPOCList[dir][numRefIdx] = slice->m_refPicList[dir][numRefIdx]->poc;
        }
    }

    h265e_dbg_func("leave\n");
}